

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::LiteralStringWithPropertyStringPtr::CloneToScriptContext
          (LiteralStringWithPropertyStringPtr *this,ScriptContext *requestContext)

{
  PropertyRecord **ppPVar1;
  ScriptContext *requestContext_local;
  LiteralStringWithPropertyStringPtr *this_local;
  
  ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                      ((WriteBarrierPtr *)&this->propertyRecord);
  if (*ppPVar1 == (PropertyRecord *)0x0) {
    this_local = (LiteralStringWithPropertyStringPtr *)
                 JavascriptString::CloneToScriptContext((JavascriptString *)this,requestContext);
  }
  else {
    ppPVar1 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                        ((WriteBarrierPtr *)&this->propertyRecord);
    this_local = (LiteralStringWithPropertyStringPtr *)
                 ScriptContext::GetPropertyString(requestContext,*ppPVar1);
  }
  return (RecyclableObject *)this_local;
}

Assistant:

RecyclableObject* LiteralStringWithPropertyStringPtr::CloneToScriptContext(ScriptContext* requestContext)
    {
        if (this->propertyRecord == nullptr)
        {
            // Without a property record, we can safely multi-reference the underlying buffer. Assertions in
            // the constructor of LiteralString will verify this.
            return __super::CloneToScriptContext(requestContext);
        }

        // We have a property record, so go ahead and make this be a property string in the request context.
        // The strings in both contexts will refer to the same property record, since property records are
        // shared among all script contexts on a thead.
        return requestContext->GetPropertyString(this->propertyRecord);
    }